

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O1

void getsize_pointer(t_getsize *x,t_gpointer *gp)

{
  char cVar1;
  t_gstub *ptVar2;
  t_symbol *ptVar3;
  int iVar4;
  t_symbol *s;
  t_symbol *ptVar5;
  t_template *x_00;
  long lVar6;
  char *pcVar7;
  char *fmt;
  bool bVar8;
  int type;
  int onset;
  t_symbol *elemtemplatesym;
  int local_40;
  int local_3c;
  t_symbol *local_38;
  
  ptVar5 = x->x_fieldsym;
  ptVar2 = gp->gp_stub;
  iVar4 = gpointer_check(gp,0);
  if (iVar4 == 0) {
    pd_error(x,"getsize: stale or empty pointer");
    return;
  }
  ptVar3 = x->x_templatesym;
  cVar1 = *ptVar3->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar8 = ptVar3 != s, s = ptVar3, bVar8)) {
    pcVar7 = ptVar3->s_name;
    ptVar5 = gpointer_gettemplatesym(gp);
    pd_error(x,"getsize %s: got wrong template (%s)",pcVar7,ptVar5->s_name);
    return;
  }
  x_00 = template_findbyname(s);
  if (x_00 == (t_template *)0x0) {
    pd_error(x,"getsize: couldn\'t find template %s",s->s_name);
    return;
  }
  iVar4 = template_find_field(x_00,ptVar5,&local_3c,&local_40,&local_38);
  if (iVar4 == 0) {
    pcVar7 = ptVar5->s_name;
    fmt = "getsize: couldn\'t find array field %s";
  }
  else {
    if (local_40 == 3) {
      lVar6 = 0x18;
      if (ptVar2->gs_which == 2) {
        lVar6 = 0;
      }
      outlet_float((x->x_obj).te_outlet,
                   (float)**(int **)((long)((gp->gp_un).gp_scalar)->sc_vec +
                                    local_3c + lVar6 + -0x18));
      return;
    }
    pcVar7 = ptVar5->s_name;
    fmt = "getsize: field %s not of type array";
  }
  pd_error(x,fmt,pcVar7);
  return;
}

Assistant:

static void getsize_pointer(t_getsize *x, t_gpointer *gp)
{
    int nitems, onset, type;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_word *w;
    t_array *array;
    int elemsize;
    t_gstub *gs = gp->gp_stub;
    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "getsize: stale or empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gp))
        {
            pd_error(x, "getsize %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "getsize: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x, "getsize: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x, "getsize: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) w = gp->gp_un.gp_w;
    else w = gp->gp_un.gp_scalar->sc_vec;

    array = *(t_array **)(((char *)w) + onset);
    outlet_float(x->x_obj.ob_outlet, (t_float)(array->a_n));
}